

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

int Curl_conn_get_stream_error(Curl_easy *data,connectdata *conn,int sockindex)

{
  Curl_cfilter *pCVar1;
  uint in_EAX;
  CURLcode CVar2;
  int iVar3;
  ulong uStack_18;
  int n;
  
  uStack_18 = (ulong)in_EAX;
  pCVar1 = conn->cfilter[sockindex];
  if (pCVar1 != (Curl_cfilter *)0x0) {
    CVar2 = (*pCVar1->cft->query)(pCVar1,data,6,&n,(void *)0x0);
    iVar3 = 0;
    if (0 < n) {
      iVar3 = n;
    }
    if (CVar2 == CURLE_OK) {
      return iVar3;
    }
  }
  return 0;
}

Assistant:

int Curl_conn_get_stream_error(struct Curl_easy *data,
                               struct connectdata *conn,
                               int sockindex)
{
  CURLcode result;
  int n = 0;

  struct Curl_cfilter *cf = conn->cfilter[sockindex];
  result = cf ? cf->cft->query(cf, data, CF_QUERY_STREAM_ERROR,
                               &n, NULL) : CURLE_UNKNOWN_OPTION;
  return (result || n < 0) ? 0 : n;
}